

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O2

void remora::bindings::ugemm<remora::bindings::syrk_block_size<double>,double,double>
               (size_t kc,double alpha,double *A,double *B,double *C,size_t stride1,size_t stride2)

{
  double dVar1;
  size_t c;
  long lVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  size_t i;
  double *pdVar6;
  undefined8 *puVar7;
  size_t j;
  long lVar8;
  type Pa;
  undefined8 local_180 [45];
  
  puVar4 = local_180;
  puVar5 = local_180;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    local_180[lVar2] = 0;
  }
  for (sVar3 = 0; sVar3 != kc; sVar3 = sVar3 + 1) {
    puVar7 = local_180;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      dVar1 = A[lVar2];
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        *(double *)((long)puVar7 + lVar8 * 8) =
             B[lVar8] * dVar1 + *(double *)((long)puVar7 + lVar8 * 8);
      }
      puVar7 = (undefined8 *)((long)puVar7 + 0x40);
    }
    A = A + 4;
    B = B + 8;
  }
  if ((alpha != 1.0) || (NAN(alpha))) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        *(double *)((long)puVar4 + lVar8 * 8) = *(double *)((long)puVar4 + lVar8 * 8) * alpha;
      }
      puVar4 = (undefined8 *)((long)puVar4 + 0x40);
    }
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    pdVar6 = C;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      *pdVar6 = *(double *)((long)puVar5 + lVar8 * 8) + *pdVar6;
      pdVar6 = pdVar6 + stride2;
    }
    puVar5 = (undefined8 *)((long)puVar5 + 0x40);
    C = C + stride1;
  }
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}